

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  long in_RSI;
  long in_RDI;
  size_t err_code;
  void *dictEnd;
  size_t dictSize;
  char *dictStart;
  ZSTD_DCtx *in_stack_ffffffffffffffd0;
  ZSTD_DDict *local_8;
  
  if (in_RDI == 0) {
    __assert_fail("dctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa173,"size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx *, const ZSTD_DDict *)")
    ;
  }
  if (in_RSI != 0) {
    pvVar2 = ZSTD_DDict_dictContent((ZSTD_DDict *)0x28aca9);
    sVar3 = ZSTD_DDict_dictSize((ZSTD_DDict *)0x28acb8);
    in_stack_ffffffffffffffd0 = (ZSTD_DCtx *)((long)pvVar2 + sVar3);
    *(uint *)(in_RDI + 0x75fc) =
         (uint)(*(ZSTD_DCtx **)(in_RDI + 0x74d8) != in_stack_ffffffffffffffd0);
  }
  local_8 = (ZSTD_DDict *)ZSTD_decompressBegin((ZSTD_DCtx *)0x28acfc);
  uVar1 = ERR_isError((size_t)local_8);
  if (uVar1 == 0) {
    if (in_RSI != 0) {
      ZSTD_copyDDictParameters(in_stack_ffffffffffffffd0,local_8);
    }
    local_8 = (ZSTD_DDict *)0x0;
  }
  return (size_t)local_8;
}

Assistant:

size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_decompressBegin_usingDDict");
    assert(dctx != NULL);
    if (ddict) {
        const char* const dictStart = (const char*)ZSTD_DDict_dictContent(ddict);
        size_t const dictSize = ZSTD_DDict_dictSize(ddict);
        const void* const dictEnd = dictStart + dictSize;
        dctx->ddictIsCold = (dctx->dictEnd != dictEnd);
        DEBUGLOG(4, "DDict is %s",
                    dctx->ddictIsCold ? "~cold~" : "hot!");
    }
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) , "");
    if (ddict) {   /* NULL ddict is equivalent to no dictionary */
        ZSTD_copyDDictParameters(dctx, ddict);
    }
    return 0;
}